

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateFlagProtoCheck
          (Lowerer *this,Instr *insertBeforeInstr,RegOpnd *opndInlineCache,
          LabelInstr *labelNotOnProto)

{
  IndirOpnd *testSrc1;
  IntConstOpnd *testSrc2;
  
  testSrc1 = IR::IndirOpnd::New(opndInlineCache,8,TyInt8,insertBeforeInstr->m_func,false);
  testSrc2 = IR::IntConstOpnd::New(8,TyInt8,this->m_func,false);
  InsertTestBranch(&testSrc1->super_Opnd,&testSrc2->super_Opnd,BrEq_A,labelNotOnProto,
                   insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateFlagProtoCheck(
    IR::Instr * insertBeforeInstr,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelNotOnProto)
{
    // Generate:
    //
    //      TEST [&(inlineCache->u.accessor.isOnProto)], Js::FlagIsOnProto
    //      JEQ $next
    IR::Opnd* flagsOpnd;
    flagsOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.rawUInt16), TyInt8, insertBeforeInstr->m_func);

    uint isOnProtoFlagMask = Js::InlineCache::GetIsOnProtoFlagMask();
    InsertTestBranch(flagsOpnd, IR::IntConstOpnd::New(isOnProtoFlagMask, TyInt8, this->m_func), Js::OpCode::BrEq_A, labelNotOnProto, insertBeforeInstr);
}